

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall tetgenio::load_var(tetgenio *this,char *filebasename)

{
  size_t sVar1;
  FILE *__stream;
  tetgenio *ptVar2;
  ulong uVar3;
  double *pdVar4;
  char *in_RCX;
  int iVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  double dVar10;
  char varfilename [1024];
  char inputline [2048];
  tetgenio *local_c40;
  char local_c38 [4];
  undefined1 auStack_c34 [1020];
  char local_838 [2056];
  
  strcpy(local_c38,filebasename);
  sVar1 = strlen(local_c38);
  builtin_strncpy(local_c38 + sVar1,".var",4);
  auStack_c34[sVar1] = 0;
  __stream = fopen(local_c38,"r");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  pcVar6 = "Opening %s.\n";
  printf("Opening %s.\n",local_c38);
  ptVar2 = (tetgenio *)readnumberline((tetgenio *)pcVar6,local_838,(FILE *)__stream,in_RCX);
  bVar8 = true;
  local_c40 = ptVar2;
  if (ptVar2 == (tetgenio *)0x0) goto LAB_0010e7f0;
  if ((char)ptVar2->firstnumber == '\0') {
    this->numberoffacetconstraints = 0;
LAB_0010e68c:
    bVar8 = true;
    local_c40 = (tetgenio *)readnumberline((tetgenio *)pcVar6,local_838,(FILE *)__stream,in_RCX);
    if (local_c40 == (tetgenio *)0x0) goto LAB_0010e7f0;
    if ((char)local_c40->firstnumber == '\0') {
      this->numberofsegmentconstraints = 0;
      goto LAB_0010e7f0;
    }
    iVar5 = 0;
    uVar3 = strtol((char *)local_c40,(char **)&local_c40,0);
    this->numberofsegmentconstraints = (int)uVar3;
    if ((int)uVar3 < 1) goto LAB_0010e7f0;
    ptVar2 = (tetgenio *)(uVar3 * 0x18 & 0x7fffffff8);
    pdVar4 = (double *)operator_new__((ulong)ptVar2);
    this->segmentconstraintlist = pdVar4;
    lVar7 = 0;
    for (; iVar5 < (int)uVar3; iVar5 = iVar5 + 1) {
      pcVar6 = readnumberline(ptVar2,local_838,(FILE *)__stream,in_RCX);
      ptVar2 = (tetgenio *)findnextnumber(ptVar2,pcVar6);
      local_c40 = ptVar2;
      if ((char)ptVar2->firstnumber == '\0') {
        pcVar6 = "Error:  segment constraint %d has no frist endpoint.\n";
LAB_0010e7d4:
        printf(pcVar6,(ulong)(uint)(this->firstnumber + iVar5));
        break;
      }
      dVar10 = strtod((char *)ptVar2,(char **)&local_c40);
      *(double *)((long)this->segmentconstraintlist + lVar7) = dVar10;
      ptVar2 = (tetgenio *)findnextnumber(ptVar2,(char *)local_c40);
      local_c40 = ptVar2;
      if ((char)ptVar2->firstnumber == '\0') {
        pcVar6 = "Error:  segment constraint %d has no second endpoint.\n";
        goto LAB_0010e7d4;
      }
      dVar10 = strtod((char *)ptVar2,(char **)&local_c40);
      *(double *)((long)this->segmentconstraintlist + lVar7 + 8) = dVar10;
      ptVar2 = (tetgenio *)findnextnumber(ptVar2,(char *)local_c40);
      local_c40 = ptVar2;
      if ((char)ptVar2->firstnumber == '\0') {
        pcVar6 = "Error:  segment constraint %d has no maximum length bound.\n";
        goto LAB_0010e7d4;
      }
      dVar10 = strtod((char *)ptVar2,(char **)&local_c40);
      *(double *)((long)this->segmentconstraintlist + lVar7 + 0x10) = dVar10;
      uVar3 = (ulong)(uint)this->numberofsegmentconstraints;
      lVar7 = lVar7 + 0x18;
    }
    bVar8 = true;
    if (this->numberofsegmentconstraints <= iVar5) goto LAB_0010e7f0;
  }
  else {
    iVar5 = 0;
    uVar3 = strtol((char *)ptVar2,(char **)&local_c40,0);
    uVar9 = (uint)uVar3;
    this->numberoffacetconstraints = uVar9;
    pcVar6 = (char *)ptVar2;
    if ((int)uVar9 < 1) goto LAB_0010e68c;
    ptVar2 = (tetgenio *)((ulong)(uVar9 & 0x7fffffff) << 4);
    pdVar4 = (double *)operator_new__((ulong)ptVar2);
    this->facetconstraintlist = pdVar4;
    lVar7 = 0;
    for (; pcVar6 = (char *)ptVar2, iVar5 < (int)uVar3; iVar5 = iVar5 + 1) {
      pcVar6 = readnumberline(ptVar2,local_838,(FILE *)__stream,in_RCX);
      ptVar2 = (tetgenio *)findnextnumber(ptVar2,pcVar6);
      local_c40 = ptVar2;
      if ((char)ptVar2->firstnumber == '\0') {
        pcVar6 = "Error:  facet constraint %d has no facet marker.\n";
LAB_0010e670:
        printf(pcVar6,(ulong)(uint)(this->firstnumber + iVar5));
        break;
      }
      dVar10 = strtod((char *)ptVar2,(char **)&local_c40);
      *(double *)((long)this->facetconstraintlist + lVar7) = dVar10;
      ptVar2 = (tetgenio *)findnextnumber(ptVar2,(char *)local_c40);
      local_c40 = ptVar2;
      if ((char)ptVar2->firstnumber == '\0') {
        pcVar6 = "Error:  facet constraint %d has no maximum area bound.\n";
        goto LAB_0010e670;
      }
      dVar10 = strtod((char *)ptVar2,(char **)&local_c40);
      *(double *)((long)this->facetconstraintlist + lVar7 + 8) = dVar10;
      uVar3 = (ulong)(uint)this->numberoffacetconstraints;
      lVar7 = lVar7 + 0x10;
    }
    if (this->numberoffacetconstraints <= iVar5) goto LAB_0010e68c;
  }
  bVar8 = false;
LAB_0010e7f0:
  fclose(__stream);
  return bVar8;
}

Assistant:

bool tetgenio::load_var(char* filebasename)
{
  FILE *infile;
  char varfilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  int index;
  int i;

  // Variant constraints are saved in file "filename.var".
  strcpy(varfilename, filebasename);
  strcat(varfilename, ".var");
  infile = fopen(varfilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", varfilename);
  } else {
    return false;
  }

  // Read the facet constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No region list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberoffacetconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberoffacetconstraints = 0;
  }
  if (numberoffacetconstraints > 0) {
    // Initialize 'facetconstraintlist'.
    facetconstraintlist = new REAL[numberoffacetconstraints * 2];
    index = 0;
    for (i = 0; i < numberoffacetconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no facet marker.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no maximum area bound.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberoffacetconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  // Read the segment constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No segment list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberofsegmentconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberofsegmentconstraints = 0;
  }
  if (numberofsegmentconstraints > 0) {
    // Initialize 'segmentconstraintlist'.
    segmentconstraintlist = new REAL[numberofsegmentconstraints * 3];
    index = 0;
    for (i = 0; i < numberofsegmentconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no frist endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no second endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no maximum length bound.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberofsegmentconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  fclose(infile);
  return true;
}